

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTestsPropertiesCommand.cxx
# Opt level: O1

bool cmSetTestsPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmTest *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pbVar3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  size_type local_78;
  pointer local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  string local_50;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar1) {
    local_88._M_len = (size_t)&local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[11]>>
                         (pbVar3,pbVar1,"PROPERTIES");
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((local_58 == pbVar2) || (local_68 = local_58 + 1, local_68 == pbVar2)) {
      local_88._M_len = (size_t)&local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 "called with illegal arguments, maybe missing a PROPERTIES specifier?","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (((long)pbVar2 - (long)local_58 >> 5 & 0x8000000000000001U) == 1) {
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar4 = pbVar2 == local_58;
        if (bVar4) {
          return bVar4;
        }
        local_60 = (string *)&status->Error;
        while( true ) {
          this = cmMakefile::GetTest(status->Makefile,pbVar2);
          if (this == (cmTest *)0x0) {
            local_70 = (pbVar2->_M_dataplus)._M_p;
            local_78 = pbVar2->_M_string_length;
            local_88._M_len = 0x28;
            local_88._M_str = "Can not find test to add properties to: ";
            views._M_len = 2;
            views._M_array = &local_88;
            cmCatViews_abi_cxx11_(&local_50,views);
            std::__cxx11::string::_M_assign(local_60);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            pbVar3 = local_68;
            if (local_68 !=
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if (pbVar3->_M_string_length != 0) {
                  cmTest::SetProperty(this,pbVar3,pbVar3 + 1);
                }
                pbVar3 = pbVar3 + 2;
              } while (pbVar3 != (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if (this == (cmTest *)0x0) break;
          pbVar2 = pbVar2 + 1;
          bVar4 = pbVar2 == local_58;
          if (bVar4) {
            return bVar4;
          }
        }
        return bVar4;
      }
      local_88._M_len = (size_t)&local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"called with incorrect number of arguments.","");
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  if ((size_type *)local_88._M_len != &local_78) {
    operator_delete((void *)local_88._M_len,local_78 + 1);
  }
  return false;
}

Assistant:

bool cmSetTestsPropertiesCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // first identify the properties arguments
  auto propsIter = std::find(args.begin(), args.end(), "PROPERTIES");
  if (propsIter == args.end() || propsIter + 1 == args.end()) {
    status.SetError("called with illegal arguments, maybe missing a "
                    "PROPERTIES specifier?");
    return false;
  }

  if (std::distance(propsIter, args.end()) % 2 != 1) {
    status.SetError("called with incorrect number of arguments.");
    return false;
  }

  // loop over all the tests
  for (const std::string& tname : cmStringRange{ args.begin(), propsIter }) {
    if (cmTest* test = status.GetMakefile().GetTest(tname)) {
      // loop through all the props and set them
      for (auto k = propsIter + 1; k != args.end(); k += 2) {
        if (!k->empty()) {
          test->SetProperty(*k, *(k + 1));
        }
      }
    } else {
      status.SetError(
        cmStrCat("Can not find test to add properties to: ", tname));
      return false;
    }
  }
  return true;
}